

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mercuryparser.cpp
# Opt level: O2

void MercuryJson::__error_maybe_escape(char *context,size_t *length,char ch)

{
  size_t sVar1;
  
  if (ch == '\0') {
    sVar1 = *length;
    *length = sVar1 + 1;
    context[sVar1] = '\"';
    return;
  }
  sVar1 = *length;
  *length = sVar1 + 1;
  if (2 < (byte)(ch - 8U)) {
    context[sVar1] = ch;
    return;
  }
  context[sVar1] = '\\';
  sVar1 = *length;
  *length = sVar1 + 1;
  if (ch == '\b') {
    context[sVar1] = 'b';
    return;
  }
  if (ch == '\n') {
    context[sVar1] = 'n';
    return;
  }
  context[sVar1] = 't';
  return;
}

Assistant:

void __error_maybe_escape(char *context, size_t *length, char ch) {
        if (ch == '\0') {
            context[(*length)++] = '"';
        } else if (ch == '\t' || ch == '\n' || ch == '\b') {
            context[(*length)++] = '\\';
            switch (ch) {
                case '\t':
                    context[(*length)++] = 't';
                    break;
                case '\n':
                    context[(*length)++] = 'n';
                    break;
                case '\b':
                    context[(*length)++] = 'b';
                    break;
                default:
                    break;
            }
        } else {
            context[(*length)++] = ch;
        }
    }